

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::InitTileOffsets
              (OffsetData *offset_data,EXRHeader *exr_header,
              vector<int,_std::allocator<int>_> *num_x_tiles,
              vector<int,_std::allocator<int>_> *num_y_tiles)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong local_48;
  size_t dy_1;
  int l_1;
  int lx;
  int ly;
  uint dy;
  uint l;
  int num_tile_blocks;
  vector<int,_std::allocator<int>_> *num_y_tiles_local;
  vector<int,_std::allocator<int>_> *num_x_tiles_local;
  EXRHeader *exr_header_local;
  OffsetData *offset_data_local;
  
  dy = 0;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(num_x_tiles);
  offset_data->num_x_levels = (int)sVar2;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(num_y_tiles);
  offset_data->num_y_levels = (int)sVar2;
  if ((uint)exr_header->tile_level_mode < 2) {
    if (offset_data->num_x_levels != offset_data->num_y_levels) {
      __assert_fail("offset_data.num_x_levels == offset_data.num_y_levels",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                    ,0x159d,
                    "int tinyexr::InitTileOffsets(OffsetData &, const EXRHeader *, const std::vector<int> &, const std::vector<int> &)"
                   );
    }
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&offset_data->offsets,(long)offset_data->num_x_levels);
    for (ly = 0; sVar2 = std::
                         vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ::size(&offset_data->offsets), (uint)ly < sVar2; ly = ly + 1) {
      pvVar3 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](&offset_data->offsets,(ulong)(uint)ly);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_y_tiles,(ulong)(uint)ly);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(pvVar3,(long)*pvVar4);
      lx = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&offset_data->offsets,(ulong)(uint)ly);
        sVar2 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::size(pvVar3);
        if (sVar2 <= (uint)lx) break;
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&offset_data->offsets,(ulong)(uint)ly);
        pvVar5 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar3,(ulong)(uint)lx);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_x_tiles,(ulong)(uint)ly);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar5,(long)*pvVar4);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_x_tiles,(ulong)(uint)ly);
        dy = *pvVar4 + dy;
        lx = lx + 1;
      }
    }
  }
  else {
    if (exr_header->tile_level_mode != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                    ,0x15bc,
                    "int tinyexr::InitTileOffsets(OffsetData &, const EXRHeader *, const std::vector<int> &, const std::vector<int> &)"
                   );
    }
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&offset_data->offsets,(long)offset_data->num_x_levels * (long)offset_data->num_y_levels
            );
    for (l_1 = 0; l_1 < offset_data->num_y_levels; l_1 = l_1 + 1) {
      for (dy_1._4_4_ = 0; dy_1._4_4_ < offset_data->num_x_levels; dy_1._4_4_ = dy_1._4_4_ + 1) {
        iVar1 = l_1 * offset_data->num_x_levels + dy_1._4_4_;
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&offset_data->offsets,(long)iVar1);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_y_tiles,(long)l_1);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::resize(pvVar3,(long)*pvVar4);
        local_48 = 0;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[](&offset_data->offsets,(long)iVar1);
          sVar2 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size(pvVar3);
          if (sVar2 <= local_48) break;
          pvVar3 = std::
                   vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[](&offset_data->offsets,(long)iVar1);
          pvVar5 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar3,local_48);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_x_tiles,(long)dy_1._4_4_);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar5,(long)*pvVar4);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](num_x_tiles,(long)dy_1._4_4_);
          dy = *pvVar4 + dy;
          local_48 = local_48 + 1;
        }
      }
    }
  }
  return dy;
}

Assistant:

static int InitTileOffsets(OffsetData& offset_data,
  const EXRHeader* exr_header,
  const std::vector<int>& num_x_tiles,
  const std::vector<int>& num_y_tiles) {
  int num_tile_blocks = 0;
  offset_data.num_x_levels = static_cast<int>(num_x_tiles.size());
  offset_data.num_y_levels = static_cast<int>(num_y_tiles.size());
  switch (exr_header->tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:
  case TINYEXR_TILE_MIPMAP_LEVELS:
    assert(offset_data.num_x_levels == offset_data.num_y_levels);
    offset_data.offsets.resize(size_t(offset_data.num_x_levels));

    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
      offset_data.offsets[l].resize(size_t(num_y_tiles[l]));

      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
        offset_data.offsets[l][dy].resize(size_t(num_x_tiles[l]));
        num_tile_blocks += num_x_tiles[l];
      }
    }
    break;

  case TINYEXR_TILE_RIPMAP_LEVELS:

    offset_data.offsets.resize(static_cast<size_t>(offset_data.num_x_levels) * static_cast<size_t>(offset_data.num_y_levels));

    for (int ly = 0; ly < offset_data.num_y_levels; ++ly) {
      for (int lx = 0; lx < offset_data.num_x_levels; ++lx) {
        int l = ly * offset_data.num_x_levels + lx;
        offset_data.offsets[size_t(l)].resize(size_t(num_y_tiles[size_t(ly)]));

        for (size_t dy = 0; dy < offset_data.offsets[size_t(l)].size(); ++dy) {
          offset_data.offsets[size_t(l)][dy].resize(size_t(num_x_tiles[size_t(lx)]));
          num_tile_blocks += num_x_tiles[size_t(lx)];
        }
      }
    }
    break;

  default:
    assert(false);
  }
  return num_tile_blocks;
}